

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O1

bool __thiscall
cmCMakePresetsGraph::ConfigurePreset::VisitPresetInherit(ConfigurePreset *this,Preset *parentPreset)

{
  Preset *pPVar1;
  
  if ((this->Generator)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&this->Generator);
  }
  if ((this->Architecture)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&this->Architecture);
  }
  if ((this->Toolset)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&this->Toolset);
  }
  if ((this->ArchitectureStrategy).
      super__Optional_base<cmCMakePresetsGraph::ArchToolsetStrategy,_true,_true>._M_payload.
      super__Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy>._M_engaged == false) {
    (this->ArchitectureStrategy).
    super__Optional_base<cmCMakePresetsGraph::ArchToolsetStrategy,_true,_true>._M_payload.
    super__Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy> =
         *(_Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy> *)
          &parentPreset[1].Hidden;
  }
  if ((this->ToolsetStrategy).
      super__Optional_base<cmCMakePresetsGraph::ArchToolsetStrategy,_true,_true>._M_payload.
      super__Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy>._M_engaged == false) {
    (this->ToolsetStrategy).
    super__Optional_base<cmCMakePresetsGraph::ArchToolsetStrategy,_true,_true>._M_payload.
    super__Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy> =
         *(_Optional_payload_base<cmCMakePresetsGraph::ArchToolsetStrategy> *)
          ((long)&parentPreset[1].DisplayName.field_2 + 8);
  }
  if ((this->BinaryDir)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&this->BinaryDir);
  }
  if ((this->InstallDir)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&this->InstallDir);
  }
  if ((this->ToolchainFile)._M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&this->ToolchainFile);
  }
  if ((this->WarnDev).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == false) {
    (this->WarnDev).super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool> =
         *(_Optional_payload_base<bool> *)
          &parentPreset[2].Inherits.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  }
  if ((this->ErrorDev).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == false) {
    (this->ErrorDev).super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool> =
         *(_Optional_payload_base<bool> *)
          ((long)&parentPreset[2].Inherits.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 2);
  }
  if ((this->WarnDeprecated).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == false) {
    (this->WarnDeprecated).super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool> =
         *(_Optional_payload_base<bool> *)
          ((long)&parentPreset[2].Inherits.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 4);
  }
  if ((this->ErrorDeprecated).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == false) {
    (this->ErrorDeprecated).super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool> =
         *(_Optional_payload_base<bool> *)
          ((long)&parentPreset[2].Inherits.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + 6);
  }
  if ((this->WarnUninitialized).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == false) {
    (this->WarnUninitialized).super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool> =
         *(_Optional_payload_base<bool> *)
          &parentPreset[2].Inherits.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  }
  if ((this->WarnUnusedCli).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == false) {
    (this->WarnUnusedCli).super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool> =
         *(_Optional_payload_base<bool> *)
          ((long)&parentPreset[2].Inherits.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + 2);
  }
  if ((this->WarnSystemVars).super__Optional_base<bool,_true,_true>._M_payload.
      super__Optional_payload_base<bool>._M_engaged == false) {
    (this->WarnSystemVars).super__Optional_base<bool,_true,_true>._M_payload.
    super__Optional_payload_base<bool> =
         *(_Optional_payload_base<bool> *)
          ((long)&parentPreset[2].Inherits.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + 4);
  }
  pPVar1 = (Preset *)parentPreset[2].Name._M_string_length;
  if (pPVar1 != parentPreset + 2) {
    do {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<cmCMakePresetsGraph::CacheVariable>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<cmCMakePresetsGraph::CacheVariable>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<cmCMakePresetsGraph::CacheVariable>>>>
      ::
      _M_insert_unique<std::pair<std::__cxx11::string_const,std::optional<cmCMakePresetsGraph::CacheVariable>>const&>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::optional<cmCMakePresetsGraph::CacheVariable>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::optional<cmCMakePresetsGraph::CacheVariable>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::optional<cmCMakePresetsGraph::CacheVariable>>>>
                  *)&this->CacheVariables,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<cmCMakePresetsGraph::CacheVariable>_>
                  *)((long)&(pPVar1->Name).field_2 + 8));
      pPVar1 = (Preset *)std::_Rb_tree_increment((_Rb_tree_node_base *)pPVar1);
    } while (pPVar1 != parentPreset + 2);
  }
  return true;
}

Assistant:

bool cmCMakePresetsGraph::ConfigurePreset::VisitPresetInherit(
  const cmCMakePresetsGraph::Preset& parentPreset)
{
  auto& preset = *this;
  const ConfigurePreset& parent =
    static_cast<const ConfigurePreset&>(parentPreset);
  InheritString(preset.Generator, parent.Generator);
  InheritString(preset.Architecture, parent.Architecture);
  InheritString(preset.Toolset, parent.Toolset);
  if (!preset.ArchitectureStrategy) {
    preset.ArchitectureStrategy = parent.ArchitectureStrategy;
  }
  if (!preset.ToolsetStrategy) {
    preset.ToolsetStrategy = parent.ToolsetStrategy;
  }
  InheritString(preset.BinaryDir, parent.BinaryDir);
  InheritString(preset.InstallDir, parent.InstallDir);
  InheritString(preset.ToolchainFile, parent.ToolchainFile);
  InheritOptionalValue(preset.WarnDev, parent.WarnDev);
  InheritOptionalValue(preset.ErrorDev, parent.ErrorDev);
  InheritOptionalValue(preset.WarnDeprecated, parent.WarnDeprecated);
  InheritOptionalValue(preset.ErrorDeprecated, parent.ErrorDeprecated);
  InheritOptionalValue(preset.WarnUninitialized, parent.WarnUninitialized);
  InheritOptionalValue(preset.WarnUnusedCli, parent.WarnUnusedCli);
  InheritOptionalValue(preset.WarnSystemVars, parent.WarnSystemVars);

  for (auto const& v : parent.CacheVariables) {
    preset.CacheVariables.insert(v);
  }

  return true;
}